

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

ExpEmit __thiscall FxConditional::Emit(FxConditional *this,VMFunctionBuilder *build)

{
  FxExpression *pFVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  ExpEmit EVar5;
  size_t loc;
  ExpEmit EVar6;
  undefined4 uVar7;
  ulong uVar8;
  int regnum;
  VM_SHALF opbc;
  ulong uVar9;
  ulong uVar10;
  ExpEmit trueop;
  anon_union_8_3_addc324a_for_ExpVal_1 local_70;
  TArray<unsigned_long,_unsigned_long> no;
  TArray<unsigned_long,_unsigned_long> yes;
  uint extraout_var;
  uint extraout_var_00;
  
  yes.Array = (unsigned_long *)0x0;
  yes.Most = 0;
  yes.Count = 0;
  no.Array = (unsigned_long *)0x0;
  no.Most = 0;
  no.Count = 0;
  (*this->condition->_vptr_FxExpression[10])(this->condition,build,0);
  VMFunctionBuilder::BackpatchListToHere(build,&yes);
  iVar3 = (*this->truex->_vptr_FxExpression[3])();
  pFVar1 = this->truex;
  if (((char)iVar3 == '\0') || (pFVar1->ValueType->RegType != '\0')) {
    EVar5._0_4_ = (*pFVar1->_vptr_FxExpression[9])(pFVar1,build);
    EVar5.Konst = (bool)(char)extraout_var;
    EVar5.Fixed = (bool)(char)(extraout_var >> 8);
    EVar5.Final = (bool)(char)(extraout_var >> 0x10);
    EVar5.Target = (bool)(char)(extraout_var >> 0x18);
    trueop = EVar5;
    if ((extraout_var & 1) == 0) {
      uVar8 = ((ulong)extraout_var & 0xfffffffe) << 0x20;
      uVar10 = (ulong)(EVar5._0_4_ & 0xff000000);
      uVar9 = (ulong)(EVar5._0_4_ & 0xff0000);
      goto LAB_0051037a;
    }
    ExpEmit::Free(&trueop,build);
    opbc = (VM_SHALF)EVar5._0_4_;
    cVar2 = (char)(EVar5._0_4_ >> 0x10);
    if (cVar2 == '\x03') {
      uVar4 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 3,1);
      EVar5.Konst = false;
      EVar5.Fixed = false;
      EVar5.Final = false;
      EVar5.Target = false;
      EVar5.RegNum = (short)uVar4;
      EVar5.RegType = (char)(uVar4 >> 0x10);
      EVar5.RegCount = (char)(uVar4 >> 0x18);
      VMFunctionBuilder::Emit(build,5,uVar4 & 0xffff,opbc);
      uVar9 = 0x30000;
    }
    else if (cVar2 == '\x02') {
      uVar4 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 2,1);
      EVar5.Konst = false;
      EVar5.Fixed = false;
      EVar5.Final = false;
      EVar5.Target = false;
      EVar5.RegNum = (short)uVar4;
      EVar5.RegType = (char)(uVar4 >> 0x10);
      EVar5.RegCount = (char)(uVar4 >> 0x18);
      VMFunctionBuilder::Emit(build,4,uVar4 & 0xffff,opbc);
      uVar9 = 0x20000;
    }
    else {
      if (cVar2 != '\x01') {
        __assert_fail("trueop.RegType == REGT_STRING",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                      ,0x11e3,"virtual ExpEmit FxConditional::Emit(VMFunctionBuilder *)");
      }
      uVar4 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 1,1);
      EVar5.Konst = false;
      EVar5.Fixed = false;
      EVar5.Final = false;
      EVar5.Target = false;
      EVar5.RegNum = (short)uVar4;
      EVar5.RegType = (char)(uVar4 >> 0x10);
      EVar5.RegCount = (char)(uVar4 >> 0x18);
      VMFunctionBuilder::Emit(build,3,uVar4 & 0xffff,opbc);
      uVar9 = 0x10000;
    }
  }
  else {
    uVar4 = VMFunctionBuilder::RegAvailability::Get(build->Registers,1);
    EVar5.Konst = false;
    EVar5.Fixed = false;
    EVar5.Final = false;
    EVar5.Target = false;
    EVar5.RegNum = (short)uVar4;
    EVar5.RegType = (char)(uVar4 >> 0x10);
    EVar5.RegCount = (char)(uVar4 >> 0x18);
    ExpVal::ExpVal((ExpVal *)&trueop,(ExpVal *)(this->truex + 1));
    if (*(char *)((long)trueop + 0x6b) == '\x01') {
      uVar7 = (undefined4)(double)CONCAT44(local_70._4_4_,local_70.Int);
    }
    else {
      uVar7 = 0;
      if (*(char *)((long)trueop + 0x6b) == '\0') {
        uVar7 = local_70.Int;
      }
    }
    VMFunctionBuilder::EmitLoadInt(build,uVar4 & 0xffff,uVar7);
    ExpVal::~ExpVal((ExpVal *)&trueop);
    uVar9 = 0;
  }
  uVar10 = 0x1000000;
  uVar8 = 0;
LAB_0051037a:
  loc = VMFunctionBuilder::Emit(build,0x44,0);
  VMFunctionBuilder::BackpatchListToHere(build,&no);
  iVar3 = (*this->falsex->_vptr_FxExpression[3])();
  pFVar1 = this->falsex;
  regnum = (int)((ulong)EVar5 & 0xffff);
  if (((char)iVar3 == '\0') || (pFVar1->ValueType->RegType != '\0')) {
    EVar6._0_4_ = (*pFVar1->_vptr_FxExpression[9])(pFVar1,build);
    EVar6.Konst = (bool)(char)extraout_var_00;
    EVar6.Fixed = (bool)(char)(extraout_var_00 >> 8);
    EVar6.Final = (bool)(char)(extraout_var_00 >> 0x10);
    EVar6.Target = (bool)(char)(extraout_var_00 >> 0x18);
    trueop = EVar6;
    if ((extraout_var_00 & 1) == 0) {
      ExpEmit::Free(&trueop,build);
      VMFunctionBuilder::Emit
                (build,(uint)this->falsex->ValueType->moveOp,regnum,EVar6._0_4_ & 0xffff,0);
    }
    else {
      cVar2 = (char)(EVar6._0_4_ >> 0x10);
      if (2 < (byte)(cVar2 - 1U)) {
        __assert_fail("falseop.RegType == REGT_STRING",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                      ,0x1207,"virtual ExpEmit FxConditional::Emit(VMFunctionBuilder *)");
      }
      VMFunctionBuilder::Emit(build,(uint)(byte)(cVar2 + 2),regnum,(VM_SHALF)EVar6._0_4_);
      ExpEmit::Free(&trueop,build);
    }
  }
  else {
    ExpVal::ExpVal((ExpVal *)&trueop,(ExpVal *)(pFVar1 + 1));
    if (*(char *)((long)trueop + 0x6b) == '\x01') {
      uVar7 = (undefined4)(double)CONCAT44(local_70._4_4_,local_70.Int);
    }
    else {
      uVar7 = 0;
      if (*(char *)((long)trueop + 0x6b) == '\0') {
        uVar7 = local_70.Int;
      }
    }
    VMFunctionBuilder::EmitLoadInt(build,regnum,uVar7);
    ExpVal::~ExpVal((ExpVal *)&trueop);
  }
  VMFunctionBuilder::BackpatchToHere(build,loc);
  TArray<unsigned_long,_unsigned_long>::~TArray(&no);
  TArray<unsigned_long,_unsigned_long>::~TArray(&yes);
  return (ExpEmit)(uVar10 | uVar8 | uVar9 | (ulong)EVar5 & 0xffff);
}

Assistant:

ExpEmit FxConditional::Emit(VMFunctionBuilder *build)
{
	size_t truejump;
	ExpEmit out, falseout;

	// The true and false expressions ought to be assigned to the
	// same temporary instead of being copied to it. Oh well; good enough
	// for now.
	TArray<size_t> yes, no;
	condition->EmitCompare(build, false, yes, no);

	build->BackpatchListToHere(yes);

	if (truex->isConstant() && truex->ValueType->GetRegType() == REGT_INT)
	{
		out = ExpEmit(build, REGT_INT);
		build->EmitLoadInt(out.RegNum, static_cast<FxConstant *>(truex)->GetValue().GetInt());
	}
	else
	{
		ExpEmit trueop = truex->Emit(build);
		if (trueop.Konst)
		{
			trueop.Free(build);
			if (trueop.RegType == REGT_FLOAT)
			{
				out = ExpEmit(build, REGT_FLOAT);
				build->Emit(OP_LKF, out.RegNum, trueop.RegNum);
			}
			else if (trueop.RegType == REGT_POINTER)
			{
				out = ExpEmit(build, REGT_POINTER);
				build->Emit(OP_LKP, out.RegNum, trueop.RegNum);
			}
			else
			{
				assert(trueop.RegType == REGT_STRING);
				out = ExpEmit(build, REGT_STRING);
				build->Emit(OP_LKS, out.RegNum, trueop.RegNum);
			}
		}
		else
		{
			// Use the register returned by the true condition as the
			// target for the false condition.
			out = trueop;
		}
	}
	// Make sure to skip the false path.
	truejump = build->Emit(OP_JMP, 0);

	// Evaluate false expression.
	build->BackpatchListToHere(no);
	if (falsex->isConstant() && falsex->ValueType->GetRegType() == REGT_INT)
	{
		build->EmitLoadInt(out.RegNum, static_cast<FxConstant *>(falsex)->GetValue().GetInt());
	}
	else
	{
		ExpEmit falseop = falsex->Emit(build);
		if (falseop.Konst)
		{
			if (falseop.RegType == REGT_FLOAT)
			{
				build->Emit(OP_LKF, out.RegNum, falseop.RegNum);
			}
			else if (falseop.RegType == REGT_POINTER)
			{
				build->Emit(OP_LKP, out.RegNum, falseop.RegNum);
			}
			else
			{
				assert(falseop.RegType == REGT_STRING);
				build->Emit(OP_LKS, out.RegNum, falseop.RegNum);
			}
			falseop.Free(build);
		}
		else
		{
			// Move result from the register returned by "false" to the one
			// returned by "true" so that only one register is returned by
			// this tree.
			falseop.Free(build);
			build->Emit(falsex->ValueType->GetMoveOp(), out.RegNum, falseop.RegNum, 0);
		}
	}
	build->BackpatchToHere(truejump);

	return out;
}